

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_input_button(nk_context *ctx,nk_buttons id,int x,int y,int down)

{
  nk_mouse_button *pnVar1;
  nk_input *in;
  nk_mouse_button *btn;
  int down_local;
  int y_local;
  int x_local;
  nk_buttons id_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3172,
                  "void nk_input_button(struct nk_context *, enum nk_buttons, int, int, int)");
  }
  if ((ctx != (nk_context *)0x0) && ((ctx->input).mouse.buttons[id].down != down)) {
    pnVar1 = (ctx->input).mouse.buttons + id;
    (pnVar1->clicked_pos).x = (float)x;
    (pnVar1->clicked_pos).y = (float)y;
    pnVar1->down = down;
    pnVar1->clicked = pnVar1->clicked + 1;
  }
  return;
}

Assistant:

NK_API void
nk_input_button(struct nk_context *ctx, enum nk_buttons id, int x, int y, int down)
{
    struct nk_mouse_button *btn;
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
    if (in->mouse.buttons[id].down == down) return;

    btn = &in->mouse.buttons[id];
    btn->clicked_pos.x = (float)x;
    btn->clicked_pos.y = (float)y;
    btn->down = down;
    btn->clicked++;
}